

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_lh_zo.c
# Opt level: O1

void glmc_look_anyup_lh_zo(float *eye,float *dir,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float ignore;
  float local_2c;
  undefined1 local_28 [16];
  
  fVar4 = *dir;
  fVar1 = modff(ABS(fVar4) + 0.5,&local_2c);
  fVar5 = dir[1];
  fVar3 = dir[2];
  fVar9 = (fVar4 + *eye) - *eye;
  fVar10 = (fVar5 + eye[1]) - eye[1];
  fVar8 = (fVar3 + eye[2]) - eye[2];
  fVar2 = fVar8 * fVar8 + fVar9 * fVar9 + fVar10 * fVar10;
  if (fVar2 < 0.0) {
    local_28 = ZEXT416((uint)fVar10);
    fVar2 = sqrtf(fVar2);
    fVar10 = (float)local_28._0_4_;
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar4 = fVar4 - fVar1 * fVar3;
  fVar3 = 1.0 / fVar2;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if (1.1920929e-07 <= fVar2) {
    fVar6 = fVar9 * fVar3;
    fVar7 = fVar10 * fVar3;
  }
  fVar2 = (float)(~-(uint)(fVar2 < 1.1920929e-07) & (uint)(fVar8 * fVar3));
  fVar3 = fVar4 * fVar2 - fVar7 * fVar1 * fVar5;
  fVar10 = fVar1 * fVar5 * fVar6 + fVar5 * fVar2;
  fVar5 = -fVar5 * fVar7 - fVar6 * fVar4;
  fVar4 = fVar5 * fVar5 + fVar3 * fVar3 + fVar10 * fVar10;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar9 = 1.0 / fVar4;
  fVar1 = 0.0;
  fVar8 = 0.0;
  if (1.1920929e-07 <= fVar4) {
    fVar1 = fVar3 * fVar9;
    fVar8 = fVar10 * fVar9;
  }
  fVar4 = (float)(~-(uint)(fVar4 < 1.1920929e-07) & (uint)(fVar5 * fVar9));
  fVar5 = fVar7 * fVar4 - fVar8 * fVar2;
  fVar3 = fVar2 * fVar1 - fVar4 * fVar6;
  fVar10 = fVar6 * fVar8 - fVar1 * fVar7;
  (*dest)[0] = fVar1;
  (*dest)[1] = fVar5;
  (*dest)[2] = fVar6;
  dest[1][0] = fVar8;
  dest[1][1] = fVar3;
  dest[1][2] = fVar7;
  dest[2][0] = fVar4;
  dest[2][1] = fVar10;
  dest[2][2] = fVar2;
  dest[3][0] = -(eye[2] * fVar4 + fVar1 * *eye + fVar8 * eye[1]);
  dest[3][1] = -(fVar10 * eye[2] + fVar5 * *eye + fVar3 * eye[1]);
  dest[3][2] = -(eye[2] * fVar2 + fVar6 * *eye + fVar7 * eye[1]);
  dest[2][3] = 0.0;
  dest[1][3] = 0.0;
  (*dest)[3] = 0.0;
  dest[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_look_anyup_lh_zo(vec3 eye, vec3 dir, mat4 dest) {
  glm_look_anyup_lh_zo(eye, dir, dest);
}